

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_boundary_chain_methods<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,true>>>>
               (vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
                *matrix)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  reference pvVar4;
  undefined4 local_6e0;
  Dimension local_6dc;
  basic_cstring<const_char> local_6d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_6c8;
  basic_cstring<const_char> local_6a0;
  basic_cstring<const_char> local_690;
  undefined4 local_680;
  Dimension local_67c;
  basic_cstring<const_char> local_678;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_668;
  basic_cstring<const_char> local_640;
  basic_cstring<const_char> local_630;
  undefined4 local_620;
  Dimension local_61c;
  basic_cstring<const_char> local_618;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_608;
  basic_cstring<const_char> local_5e0;
  basic_cstring<const_char> local_5d0;
  undefined4 local_5c0;
  Dimension local_5bc;
  basic_cstring<const_char> local_5b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_5a8;
  basic_cstring<const_char> local_580;
  basic_cstring<const_char> local_570;
  undefined4 local_560;
  Dimension local_55c;
  basic_cstring<const_char> local_558;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_548;
  basic_cstring<const_char> local_520;
  basic_cstring<const_char> local_510;
  undefined4 local_500;
  Dimension local_4fc;
  basic_cstring<const_char> local_4f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_4e8;
  basic_cstring<const_char> local_4c0;
  basic_cstring<const_char> local_4b0;
  undefined4 local_4a0;
  Field_element local_49c;
  basic_cstring<const_char> local_498;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_488;
  basic_cstring<const_char> local_460;
  basic_cstring<const_char> local_450;
  undefined4 local_440;
  Field_element local_43c;
  basic_cstring<const_char> local_438;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_428;
  basic_cstring<const_char> local_400;
  basic_cstring<const_char> local_3f0;
  undefined4 local_3e0;
  Field_element local_3dc;
  basic_cstring<const_char> local_3d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3c8;
  basic_cstring<const_char> local_3a0;
  basic_cstring<const_char> local_390;
  undefined4 local_380;
  Field_element local_37c;
  basic_cstring<const_char> local_378;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_368;
  basic_cstring<const_char> local_340;
  basic_cstring<const_char> local_330;
  undefined4 local_320;
  Field_element local_31c;
  basic_cstring<const_char> local_318;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_308;
  basic_cstring<const_char> local_2e0;
  basic_cstring<const_char> local_2d0;
  undefined4 local_2c0;
  Field_element local_2bc;
  basic_cstring<const_char> local_2b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2a8;
  basic_cstring<const_char> local_280;
  basic_cstring<const_char> local_270;
  undefined4 local_260;
  ID_index local_25c;
  basic_cstring<const_char> local_258;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_248;
  basic_cstring<const_char> local_220;
  basic_cstring<const_char> local_210;
  undefined4 local_200;
  ID_index local_1fc;
  basic_cstring<const_char> local_1f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1e8;
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  undefined4 local_1a0;
  ID_index local_19c;
  basic_cstring<const_char> local_198;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_188;
  basic_cstring<const_char> local_160;
  basic_cstring<const_char> local_150;
  undefined4 local_140;
  ID_index local_13c;
  basic_cstring<const_char> local_138;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_128;
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0;
  undefined4 local_e0;
  ID_index local_dc;
  basic_cstring<const_char> local_d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c8;
  basic_cstring<const_char> local_a0;
  basic_cstring<const_char> local_90;
  undefined4 local_7c;
  ID_index local_78 [4];
  basic_cstring<const_char> local_68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_58;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
  *local_10;
  vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
  *matrix_local;
  
  local_10 = matrix;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_20,0x358,&local_30);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_58,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,0);
    local_78[0] = Gudhi::persistence_matrix::
                  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                  ::get_pivot(pvVar4);
    local_7c = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_58,&local_68,0x358,1,2,local_78,"matrix[0].get_pivot()",&local_7c,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_90,0x359,&local_a0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c8,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,1);
    local_dc = Gudhi::persistence_matrix::
               List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
               ::get_pivot(pvVar4);
    local_e0 = 6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_c8,&local_d8,0x359,1,2,&local_dc,"matrix[1].get_pivot()",&local_e0,"6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_100);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f0,0x35a,&local_100);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_128,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,2);
    local_13c = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_pivot(pvVar4);
    local_140 = 6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_128,&local_138,0x35a,1,2,&local_13c,"matrix[2].get_pivot()",&local_140,"6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_128);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_150,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_160);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_150,0x35b,&local_160);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_188,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,3);
    local_19c = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_pivot(pvVar4);
    local_1a0 = 0xffffffff;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_188,&local_198,0x35b,1,2,&local_19c,"matrix[3].get_pivot()",&local_1a0,"-1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1b0,0x35c,&local_1c0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1e8,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,4);
    local_1fc = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_pivot(pvVar4);
    local_200 = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_1e8,&local_1f8,0x35c,1,2,&local_1fc,"matrix[4].get_pivot()",&local_200,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_220);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_210,0x35d,&local_220);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_248,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,5);
    local_25c = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_pivot(pvVar4);
    local_260 = 6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_248,&local_258,0x35d,1,2,&local_25c,"matrix[5].get_pivot()",&local_260,"6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_248);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_280);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_270,0x360,&local_280);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2a8,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,0);
    local_2bc = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_pivot_value(pvVar4);
    local_2c0 = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_2a8,&local_2b8,0x360,1,2,&local_2bc,"matrix[0].get_pivot_value()",&local_2c0,
               "4u");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_2a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2d0,0x361,&local_2e0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_308,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_318,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,1);
    local_31c = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_pivot_value(pvVar4);
    local_320 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_308,&local_318,0x361,1,2,&local_31c,"matrix[1].get_pivot_value()",&local_320,
               "1u");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_308);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_340);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_330,0x362,&local_340);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_368,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_378,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,2);
    local_37c = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_pivot_value(pvVar4);
    local_380 = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_368,&local_378,0x362,1,2,&local_37c,"matrix[2].get_pivot_value()",&local_380,
               "4u");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_368);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_390,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_390,0x363,&local_3a0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3c8,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,3);
    local_3dc = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_pivot_value(pvVar4);
    local_3e0 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_3c8,&local_3d8,0x363,1,2,&local_3dc,"matrix[3].get_pivot_value()",&local_3e0,
               "0u");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_400);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3f0,0x364,&local_400);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_428,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_438,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,4);
    local_43c = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_pivot_value(pvVar4);
    local_440 = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_428,&local_438,0x364,1,2,&local_43c,"matrix[4].get_pivot_value()",&local_440,
               "4u");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_428);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_450,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_460);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_450,0x365,&local_460);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_488,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_498,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,5);
    local_49c = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_pivot_value(pvVar4);
    local_4a0 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_488,&local_498,0x365,1,2,&local_49c,"matrix[5].get_pivot_value()",&local_4a0,
               "1u");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_488);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4b0,0x368,&local_4c0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_4e8,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,0);
    local_4fc = Gudhi::persistence_matrix::
                Column_dimension_holder<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_dimension(&pvVar4->super_Column_dimension_option);
    local_500 = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_4e8,&local_4f8,0x368,1,2,&local_4fc,"matrix[0].get_dimension()",&local_500,"4"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_4e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_510,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_520);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_510,0x369,&local_520);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_548,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_558,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,1);
    local_55c = Gudhi::persistence_matrix::
                Column_dimension_holder<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_dimension(&pvVar4->super_Column_dimension_option);
    local_560 = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_548,&local_558,0x369,1,2,&local_55c,"matrix[1].get_dimension()",&local_560,"4"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_570,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_580);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_570,0x36a,&local_580);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_5a8,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,2);
    local_5bc = Gudhi::persistence_matrix::
                Column_dimension_holder<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_dimension(&pvVar4->super_Column_dimension_option);
    local_5c0 = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_5a8,&local_5b8,0x36a,1,2,&local_5bc,"matrix[2].get_dimension()",&local_5c0,"4"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_5a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5d0,0x36b,&local_5e0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_608,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_618,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,3);
    local_61c = Gudhi::persistence_matrix::
                Column_dimension_holder<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_dimension(&pvVar4->super_Column_dimension_option);
    local_620 = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_608,&local_618,0x36b,1,2,&local_61c,"matrix[3].get_dimension()",&local_620,"4"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_608);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_630,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_640);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_630,0x36c,&local_640);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_668,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_678,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,4);
    local_67c = Gudhi::persistence_matrix::
                Column_dimension_holder<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_dimension(&pvVar4->super_Column_dimension_option);
    local_680 = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_668,&local_678,0x36c,1,2,&local_67c,"matrix[4].get_dimension()",&local_680,"4"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_668);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_690,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_690,0x36d,&local_6a0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_6c8,plVar3,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>_>
             ::operator[](local_10,5);
    local_6dc = Gudhi::persistence_matrix::
                Column_dimension_holder<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
                ::get_dimension(&pvVar4->super_Column_dimension_option);
    local_6e0 = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_6c8,&local_6d8,0x36d,1,2,&local_6dc,"matrix[5].get_dimension()",&local_6e0,"4"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

void column_test_boundary_chain_methods(std::vector<Column>& matrix) {
  BOOST_CHECK_EQUAL(matrix[0].get_pivot(), 5);
  BOOST_CHECK_EQUAL(matrix[1].get_pivot(), 6);
  BOOST_CHECK_EQUAL(matrix[2].get_pivot(), 6);
  BOOST_CHECK_EQUAL(matrix[3].get_pivot(), -1);
  BOOST_CHECK_EQUAL(matrix[4].get_pivot(), 5);
  BOOST_CHECK_EQUAL(matrix[5].get_pivot(), 6);

  if constexpr (!is_z2<Column>()) {
    BOOST_CHECK_EQUAL(matrix[0].get_pivot_value(), 4u);
    BOOST_CHECK_EQUAL(matrix[1].get_pivot_value(), 1u);
    BOOST_CHECK_EQUAL(matrix[2].get_pivot_value(), 4u);
    BOOST_CHECK_EQUAL(matrix[3].get_pivot_value(), 0u);
    BOOST_CHECK_EQUAL(matrix[4].get_pivot_value(), 4u);
    BOOST_CHECK_EQUAL(matrix[5].get_pivot_value(), 1u);
  }

  BOOST_CHECK_EQUAL(matrix[0].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[1].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[2].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[3].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[4].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[5].get_dimension(), 4);
}